

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

Gia_Man_t * Gia_SweeperFraigTest(Gia_Man_t *pInit,int nWords,int nConfs,int fVerbose)

{
  int iVar1;
  Gia_Man_t *pGia_00;
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar2;
  bool bVar3;
  int local_44;
  int i;
  Vec_Int_t *vOuts;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGia;
  Gia_Man_t *p;
  int fVerbose_local;
  int nConfs_local;
  int nWords_local;
  Gia_Man_t *pInit_local;
  
  pGia_00 = Gia_ManDupOneHot(pInit);
  Gia_SweeperStart(pGia_00);
  iVar1 = Gia_ManPoNum(pGia_00);
  p_00 = Vec_IntAlloc(iVar1);
  local_44 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(pGia_00);
    bVar3 = false;
    if (local_44 < iVar1) {
      vOuts = (Vec_Int_t *)Gia_ManCo(pGia_00,local_44);
      bVar3 = vOuts != (Vec_Int_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ManPoNum(pGia_00);
    if (local_44 < iVar1 - pGia_00->nConstrs) {
      iVar1 = Gia_ObjFaninLit0p(pGia_00,(Gia_Obj_t *)vOuts);
      iVar1 = Gia_SweeperProbeCreate(pGia_00,iVar1);
      Vec_IntPush(p_00,iVar1);
    }
    else {
      iVar1 = Gia_ObjFaninLit0p(pGia_00,(Gia_Obj_t *)vOuts);
      iVar1 = Gia_SweeperProbeCreate(pGia_00,iVar1);
      Gia_SweeperCondPush(pGia_00,iVar1);
    }
    local_44 = local_44 + 1;
  }
  pGVar2 = Gia_SweeperSweep(pGia_00,p_00,nWords,nConfs,fVerbose,0);
  Vec_IntFree(p_00);
  Gia_SweeperStop(pGia_00);
  Gia_ManStop(pGia_00);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_SweeperFraigTest( Gia_Man_t * pInit, int nWords, int nConfs, int fVerbose )
{
    Gia_Man_t * p, * pGia;
    Gia_Obj_t * pObj;
    Vec_Int_t * vOuts;
    int i;
    // add one-hotness constraints
    p = Gia_ManDupOneHot( pInit );
    // create sweeper
    Gia_SweeperStart( p );
    // collect outputs and create conditions
    vOuts = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
        if ( i < Gia_ManPoNum(p) - p->nConstrs )  // this is the user's output
            Vec_IntPush( vOuts, Gia_SweeperProbeCreate( p,  Gia_ObjFaninLit0p(p, pObj) ) );
        else // this is a constraint
            Gia_SweeperCondPush( p, Gia_SweeperProbeCreate( p, Gia_ObjFaninLit0p(p, pObj) ) );
    // perform the sweeping
    pGia = Gia_SweeperSweep( p, vOuts, nWords, nConfs, fVerbose, 0 );
//    pGia = Gia_ManDup( p );
    Vec_IntFree( vOuts );
    // sop the sweeper
    Gia_SweeperStop( p );
    Gia_ManStop( p );
    return pGia;
}